

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O1

void __thiscall
llvm::DWARFDebugLoc::LocationList::dump
          (LocationList *this,raw_ostream *OS,uint64_t BaseAddress,bool IsLittleEndian,
          uint AddressSize,MCRegisterInfo *MRI,DWARFUnit *U,DIDumpOptions DumpOpts,uint Indent)

{
  long *plVar1;
  char *pcVar2;
  int iVar3;
  ulong uVar4;
  undefined7 in_register_00000009;
  size_t __n;
  void *__buf;
  void *extraout_RDX;
  undefined4 in_register_00000084;
  Entry *E;
  long *plVar5;
  StringRef Str;
  ArrayRef<unsigned_char> Data;
  format_object_base local_68;
  long local_58;
  int local_50;
  int local_4c;
  raw_ostream *local_48;
  undefined8 local_40;
  int local_38;
  uint local_34;
  
  local_40 = CONCAT44(in_register_00000084,AddressSize);
  __n = CONCAT71(in_register_00000009,IsLittleEndian);
  uVar4 = (ulong)(this->Entries).super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>.
                 super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
                 super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                 super_SmallVectorBase.Size;
  if (uVar4 != 0) {
    plVar5 = (long *)(this->Entries).super_SmallVectorImpl<llvm::DWARFDebugLoc::Entry>.
                     super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>.
                     super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                     super_SmallVectorBase.BeginX;
    plVar1 = plVar5 + uVar4 * 5;
    iVar3 = AddressSize * 2;
    local_34 = (uint)IsLittleEndian;
    __buf = (void *)BaseAddress;
    local_48 = OS;
    local_38 = iVar3;
    do {
      pcVar2 = OS->OutBufCur;
      if (pcVar2 < OS->OutBufEnd) {
        OS->OutBufCur = pcVar2 + 1;
        *pcVar2 = '\n';
      }
      else {
        raw_ostream::write(OS,10,__buf,__n);
      }
      raw_ostream::indent(OS,Indent);
      local_58 = *plVar5 + BaseAddress;
      local_68.Fmt = "[0x%*.*lx, ";
      local_68._vptr_format_object_base = (_func_int **)&PTR_home_01098030;
      local_50 = iVar3;
      local_4c = iVar3;
      raw_ostream::operator<<(local_48,&local_68);
      OS = local_48;
      local_58 = plVar5[1] + BaseAddress;
      local_68.Fmt = " 0x%*.*lx)";
      local_68._vptr_format_object_base = (_func_int **)&PTR_home_01098030;
      local_50 = iVar3;
      local_4c = iVar3;
      raw_ostream::operator<<(local_48,&local_68);
      Str.Length = 2;
      Str.Data = ": ";
      raw_ostream::operator<<(OS,Str);
      __n = (size_t)local_34;
      Data.Length._4_4_ = 0;
      Data._0_12_ = *(undefined1 (*) [12])(plVar5 + 2);
      dumpExpression(OS,Data,SUB41(local_34,0),(uint)local_40,MRI,U);
      plVar5 = plVar5 + 5;
      __buf = extraout_RDX;
    } while (plVar5 != plVar1);
  }
  return;
}

Assistant:

void DWARFDebugLoc::LocationList::dump(raw_ostream &OS, uint64_t BaseAddress,
                                       bool IsLittleEndian,
                                       unsigned AddressSize,
                                       const MCRegisterInfo *MRI, DWARFUnit *U,
                                       DIDumpOptions DumpOpts,
                                       unsigned Indent) const {
  for (const Entry &E : Entries) {
    OS << '\n';
    OS.indent(Indent);
    OS << format("[0x%*.*" PRIx64 ", ", AddressSize * 2, AddressSize * 2,
                 BaseAddress + E.Begin);
    OS << format(" 0x%*.*" PRIx64 ")", AddressSize * 2, AddressSize * 2,
                 BaseAddress + E.End);
    OS << ": ";

    dumpExpression(OS, E.Loc, IsLittleEndian, AddressSize, MRI, U);
  }
}